

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_16,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<16,_embree::avx512::ObjectIntersectorK<16,_true>_>,_false>
     ::occluded(vint<16> *valid_i,Intersectors *This,RayK<16> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 auVar21 [64];
  AABBNodeMB4D *node1;
  ulong uVar22;
  ulong uVar23;
  RTCIntersectFunctionN p_Var24;
  ushort uVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong *puVar30;
  undefined1 (*pauVar31) [64];
  bool bVar32;
  bool bVar33;
  ulong uVar34;
  ulong uVar35;
  int iVar36;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  int iVar72;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar73 [64];
  vint<16> mask;
  NodeRef stack_node [241];
  vfloat<16> stack_near [241];
  RTCIntersectFunctionNArguments local_4708;
  Geometry *local_46d8;
  undefined8 local_46d0;
  RTCIntersectArguments *local_46c8;
  undefined1 local_46c0 [64];
  undefined1 local_4680 [64];
  undefined1 local_4640 [64];
  undefined1 local_4600 [64];
  undefined1 local_45c0 [64];
  undefined1 local_4580 [64];
  undefined1 local_4540 [64];
  undefined1 local_4500 [64];
  undefined1 local_44c0 [64];
  undefined8 local_4450;
  ulong local_4448 [241];
  undefined1 local_3cc0 [64];
  undefined1 local_3c80 [64];
  undefined1 local_3c40 [15376];
  undefined1 auVar45 [64];
  
  local_4448[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_4448[0] != 8) {
    auVar37 = vpternlogd_avx512f(in_ZMM1,in_ZMM1,in_ZMM1,0xff);
    auVar73 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar34 = vcmpps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar73,5);
    uVar29 = vpcmpeqd_avx512f(auVar37,(undefined1  [64])valid_i->field_0);
    uVar34 = uVar34 & uVar29;
    if ((ushort)uVar34 != 0) {
      auVar38 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
      auVar37 = *(undefined1 (*) [64])(ray + 0x100);
      auVar49 = *(undefined1 (*) [64])(ray + 0x140);
      auVar46 = *(undefined1 (*) [64])(ray + 0x180);
      auVar39 = vandps_avx512dq(auVar37,auVar38);
      auVar40 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
      uVar29 = vcmpps_avx512f(auVar39,auVar40,1);
      bVar33 = (bool)((byte)uVar29 & 1);
      iVar36 = auVar40._0_4_;
      auVar39._0_4_ = (uint)bVar33 * iVar36 | (uint)!bVar33 * auVar37._0_4_;
      bVar33 = (bool)((byte)(uVar29 >> 1) & 1);
      iVar58 = auVar40._4_4_;
      auVar39._4_4_ = (uint)bVar33 * iVar58 | (uint)!bVar33 * auVar37._4_4_;
      bVar33 = (bool)((byte)(uVar29 >> 2) & 1);
      iVar59 = auVar40._8_4_;
      auVar39._8_4_ = (uint)bVar33 * iVar59 | (uint)!bVar33 * auVar37._8_4_;
      bVar33 = (bool)((byte)(uVar29 >> 3) & 1);
      iVar60 = auVar40._12_4_;
      auVar39._12_4_ = (uint)bVar33 * iVar60 | (uint)!bVar33 * auVar37._12_4_;
      bVar33 = (bool)((byte)(uVar29 >> 4) & 1);
      iVar61 = auVar40._16_4_;
      auVar39._16_4_ = (uint)bVar33 * iVar61 | (uint)!bVar33 * auVar37._16_4_;
      bVar33 = (bool)((byte)(uVar29 >> 5) & 1);
      iVar62 = auVar40._20_4_;
      auVar39._20_4_ = (uint)bVar33 * iVar62 | (uint)!bVar33 * auVar37._20_4_;
      bVar33 = (bool)((byte)(uVar29 >> 6) & 1);
      iVar63 = auVar40._24_4_;
      auVar39._24_4_ = (uint)bVar33 * iVar63 | (uint)!bVar33 * auVar37._24_4_;
      bVar33 = (bool)((byte)(uVar29 >> 7) & 1);
      iVar64 = auVar40._28_4_;
      auVar39._28_4_ = (uint)bVar33 * iVar64 | (uint)!bVar33 * auVar37._28_4_;
      bVar33 = (bool)((byte)(uVar29 >> 8) & 1);
      iVar65 = auVar40._32_4_;
      auVar39._32_4_ = (uint)bVar33 * iVar65 | (uint)!bVar33 * auVar37._32_4_;
      bVar33 = (bool)((byte)(uVar29 >> 9) & 1);
      iVar66 = auVar40._36_4_;
      auVar39._36_4_ = (uint)bVar33 * iVar66 | (uint)!bVar33 * auVar37._36_4_;
      bVar33 = (bool)((byte)(uVar29 >> 10) & 1);
      iVar67 = auVar40._40_4_;
      auVar39._40_4_ = (uint)bVar33 * iVar67 | (uint)!bVar33 * auVar37._40_4_;
      bVar33 = (bool)((byte)(uVar29 >> 0xb) & 1);
      iVar68 = auVar40._44_4_;
      auVar39._44_4_ = (uint)bVar33 * iVar68 | (uint)!bVar33 * auVar37._44_4_;
      bVar33 = (bool)((byte)(uVar29 >> 0xc) & 1);
      iVar69 = auVar40._48_4_;
      auVar39._48_4_ = (uint)bVar33 * iVar69 | (uint)!bVar33 * auVar37._48_4_;
      bVar33 = (bool)((byte)(uVar29 >> 0xd) & 1);
      iVar70 = auVar40._52_4_;
      auVar39._52_4_ = (uint)bVar33 * iVar70 | (uint)!bVar33 * auVar37._52_4_;
      bVar33 = (bool)((byte)(uVar29 >> 0xe) & 1);
      iVar71 = auVar40._56_4_;
      iVar72 = auVar40._60_4_;
      auVar39._56_4_ = (uint)bVar33 * iVar71 | (uint)!bVar33 * auVar37._56_4_;
      bVar33 = SUB81(uVar29 >> 0xf,0);
      auVar39._60_4_ = (uint)bVar33 * iVar72 | (uint)!bVar33 * auVar37._60_4_;
      auVar37 = vandps_avx512dq(auVar46,auVar38);
      uVar29 = vcmpps_avx512f(auVar37,auVar40,1);
      auVar37 = vrcp14ps_avx512f(auVar39);
      bVar33 = (bool)((byte)uVar29 & 1);
      auVar43._0_4_ = (uint)bVar33 * iVar36 | (uint)!bVar33 * auVar46._0_4_;
      bVar33 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar43._4_4_ = (uint)bVar33 * iVar58 | (uint)!bVar33 * auVar46._4_4_;
      bVar33 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar43._8_4_ = (uint)bVar33 * iVar59 | (uint)!bVar33 * auVar46._8_4_;
      bVar33 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar43._12_4_ = (uint)bVar33 * iVar60 | (uint)!bVar33 * auVar46._12_4_;
      bVar33 = (bool)((byte)(uVar29 >> 4) & 1);
      auVar43._16_4_ = (uint)bVar33 * iVar61 | (uint)!bVar33 * auVar46._16_4_;
      bVar33 = (bool)((byte)(uVar29 >> 5) & 1);
      auVar43._20_4_ = (uint)bVar33 * iVar62 | (uint)!bVar33 * auVar46._20_4_;
      bVar33 = (bool)((byte)(uVar29 >> 6) & 1);
      auVar43._24_4_ = (uint)bVar33 * iVar63 | (uint)!bVar33 * auVar46._24_4_;
      bVar33 = (bool)((byte)(uVar29 >> 7) & 1);
      auVar43._28_4_ = (uint)bVar33 * iVar64 | (uint)!bVar33 * auVar46._28_4_;
      bVar33 = (bool)((byte)(uVar29 >> 8) & 1);
      auVar43._32_4_ = (uint)bVar33 * iVar65 | (uint)!bVar33 * auVar46._32_4_;
      bVar33 = (bool)((byte)(uVar29 >> 9) & 1);
      auVar43._36_4_ = (uint)bVar33 * iVar66 | (uint)!bVar33 * auVar46._36_4_;
      bVar33 = (bool)((byte)(uVar29 >> 10) & 1);
      auVar43._40_4_ = (uint)bVar33 * iVar67 | (uint)!bVar33 * auVar46._40_4_;
      bVar33 = (bool)((byte)(uVar29 >> 0xb) & 1);
      auVar43._44_4_ = (uint)bVar33 * iVar68 | (uint)!bVar33 * auVar46._44_4_;
      bVar33 = (bool)((byte)(uVar29 >> 0xc) & 1);
      auVar43._48_4_ = (uint)bVar33 * iVar69 | (uint)!bVar33 * auVar46._48_4_;
      bVar33 = (bool)((byte)(uVar29 >> 0xd) & 1);
      auVar43._52_4_ = (uint)bVar33 * iVar70 | (uint)!bVar33 * auVar46._52_4_;
      bVar33 = (bool)((byte)(uVar29 >> 0xe) & 1);
      auVar43._56_4_ = (uint)bVar33 * iVar71 | (uint)!bVar33 * auVar46._56_4_;
      bVar33 = SUB81(uVar29 >> 0xf,0);
      auVar43._60_4_ = (uint)bVar33 * iVar72 | (uint)!bVar33 * auVar46._60_4_;
      auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar42 = vrcp14ps_avx512f(auVar43);
      auVar39 = vfnmadd213ps_avx512f(auVar39,auVar37,auVar41);
      auVar43 = vfnmadd213ps_avx512f(auVar43,auVar42,auVar41);
      auVar44 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
      auVar45 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0xc0),auVar73);
      bVar33 = (bool)((byte)uVar34 & 1);
      auVar46._0_4_ = (uint)bVar33 * auVar45._0_4_ | (uint)!bVar33 * auVar44._0_4_;
      bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar46._4_4_ = (uint)bVar33 * auVar45._4_4_ | (uint)!bVar33 * auVar44._4_4_;
      bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar46._8_4_ = (uint)bVar33 * auVar45._8_4_ | (uint)!bVar33 * auVar44._8_4_;
      bVar33 = (bool)((byte)(uVar34 >> 3) & 1);
      auVar46._12_4_ = (uint)bVar33 * auVar45._12_4_ | (uint)!bVar33 * auVar44._12_4_;
      bVar33 = (bool)((byte)(uVar34 >> 4) & 1);
      auVar46._16_4_ = (uint)bVar33 * auVar45._16_4_ | (uint)!bVar33 * auVar44._16_4_;
      bVar33 = (bool)((byte)(uVar34 >> 5) & 1);
      auVar46._20_4_ = (uint)bVar33 * auVar45._20_4_ | (uint)!bVar33 * auVar44._20_4_;
      bVar33 = (bool)((byte)(uVar34 >> 6) & 1);
      auVar46._24_4_ = (uint)bVar33 * auVar45._24_4_ | (uint)!bVar33 * auVar44._24_4_;
      bVar33 = (bool)((byte)(uVar34 >> 7) & 1);
      auVar46._28_4_ = (uint)bVar33 * auVar45._28_4_ | (uint)!bVar33 * auVar44._28_4_;
      bVar9 = (byte)(uVar34 >> 8);
      bVar33 = (bool)(bVar9 & 1);
      auVar46._32_4_ = (uint)bVar33 * auVar45._32_4_ | (uint)!bVar33 * auVar44._32_4_;
      bVar33 = (bool)((byte)(uVar34 >> 9) & 1);
      auVar46._36_4_ = (uint)bVar33 * auVar45._36_4_ | (uint)!bVar33 * auVar44._36_4_;
      bVar33 = (bool)((byte)(uVar34 >> 10) & 1);
      auVar46._40_4_ = (uint)bVar33 * auVar45._40_4_ | (uint)!bVar33 * auVar44._40_4_;
      bVar33 = (bool)((byte)(uVar34 >> 0xb) & 1);
      auVar46._44_4_ = (uint)bVar33 * auVar45._44_4_ | (uint)!bVar33 * auVar44._44_4_;
      bVar33 = (bool)((byte)(uVar34 >> 0xc) & 1);
      auVar46._48_4_ = (uint)bVar33 * auVar45._48_4_ | (uint)!bVar33 * auVar44._48_4_;
      bVar33 = (bool)((byte)(uVar34 >> 0xd) & 1);
      auVar46._52_4_ = (uint)bVar33 * auVar45._52_4_ | (uint)!bVar33 * auVar44._52_4_;
      bVar33 = (bool)((byte)(uVar34 >> 0xe) & 1);
      auVar46._56_4_ = (uint)bVar33 * auVar45._56_4_ | (uint)!bVar33 * auVar44._56_4_;
      bVar33 = SUB81(uVar34 >> 0xf,0);
      auVar46._60_4_ = (uint)bVar33 * auVar45._60_4_ | (uint)!bVar33 * auVar44._60_4_;
      uVar27 = (uint)(ushort)~(ushort)uVar34;
      auVar45 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar47 = vxorps_avx512dq(auVar45,*(undefined1 (*) [64])ray);
      auVar48 = vxorps_avx512dq(auVar45,*(undefined1 (*) [64])(ray + 0x40));
      auVar38 = vandps_avx512dq(auVar49,auVar38);
      uVar29 = vcmpps_avx512f(auVar38,auVar40,1);
      bVar33 = (bool)((byte)uVar29 & 1);
      auVar40._0_4_ = (uint)bVar33 * iVar36 | (uint)!bVar33 * auVar49._0_4_;
      bVar33 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar40._4_4_ = (uint)bVar33 * iVar58 | (uint)!bVar33 * auVar49._4_4_;
      bVar33 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar40._8_4_ = (uint)bVar33 * iVar59 | (uint)!bVar33 * auVar49._8_4_;
      bVar33 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar40._12_4_ = (uint)bVar33 * iVar60 | (uint)!bVar33 * auVar49._12_4_;
      bVar33 = (bool)((byte)(uVar29 >> 4) & 1);
      auVar40._16_4_ = (uint)bVar33 * iVar61 | (uint)!bVar33 * auVar49._16_4_;
      bVar33 = (bool)((byte)(uVar29 >> 5) & 1);
      auVar40._20_4_ = (uint)bVar33 * iVar62 | (uint)!bVar33 * auVar49._20_4_;
      bVar33 = (bool)((byte)(uVar29 >> 6) & 1);
      auVar40._24_4_ = (uint)bVar33 * iVar63 | (uint)!bVar33 * auVar49._24_4_;
      bVar33 = (bool)((byte)(uVar29 >> 7) & 1);
      auVar40._28_4_ = (uint)bVar33 * iVar64 | (uint)!bVar33 * auVar49._28_4_;
      bVar33 = (bool)((byte)(uVar29 >> 8) & 1);
      auVar40._32_4_ = (uint)bVar33 * iVar65 | (uint)!bVar33 * auVar49._32_4_;
      bVar33 = (bool)((byte)(uVar29 >> 9) & 1);
      auVar40._36_4_ = (uint)bVar33 * iVar66 | (uint)!bVar33 * auVar49._36_4_;
      bVar33 = (bool)((byte)(uVar29 >> 10) & 1);
      auVar40._40_4_ = (uint)bVar33 * iVar67 | (uint)!bVar33 * auVar49._40_4_;
      bVar33 = (bool)((byte)(uVar29 >> 0xb) & 1);
      auVar40._44_4_ = (uint)bVar33 * iVar68 | (uint)!bVar33 * auVar49._44_4_;
      bVar33 = (bool)((byte)(uVar29 >> 0xc) & 1);
      auVar40._48_4_ = (uint)bVar33 * iVar69 | (uint)!bVar33 * auVar49._48_4_;
      bVar33 = (bool)((byte)(uVar29 >> 0xd) & 1);
      auVar40._52_4_ = (uint)bVar33 * iVar70 | (uint)!bVar33 * auVar49._52_4_;
      bVar33 = (bool)((byte)(uVar29 >> 0xe) & 1);
      auVar40._56_4_ = (uint)bVar33 * iVar71 | (uint)!bVar33 * auVar49._56_4_;
      bVar33 = SUB81(uVar29 >> 0xf,0);
      auVar40._60_4_ = (uint)bVar33 * iVar72 | (uint)!bVar33 * auVar49._60_4_;
      auVar49 = vrcp14ps_avx512f(auVar40);
      auVar45 = vxorps_avx512dq(auVar45,*(undefined1 (*) [64])(ray + 0x80));
      auVar38 = vfnmadd213ps_avx512f(auVar40,auVar49,auVar41);
      auVar49 = vfmadd132ps_avx512f(auVar38,auVar49,auVar49);
      auVar40 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      auVar73 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar73);
      bVar33 = (bool)((byte)uVar34 & 1);
      auVar38._0_4_ = (uint)bVar33 * auVar73._0_4_ | (uint)!bVar33 * auVar40._0_4_;
      bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar38._4_4_ = (uint)bVar33 * auVar73._4_4_ | (uint)!bVar33 * auVar40._4_4_;
      bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar38._8_4_ = (uint)bVar33 * auVar73._8_4_ | (uint)!bVar33 * auVar40._8_4_;
      bVar33 = (bool)((byte)(uVar34 >> 3) & 1);
      auVar38._12_4_ = (uint)bVar33 * auVar73._12_4_ | (uint)!bVar33 * auVar40._12_4_;
      bVar33 = (bool)((byte)(uVar34 >> 4) & 1);
      auVar38._16_4_ = (uint)bVar33 * auVar73._16_4_ | (uint)!bVar33 * auVar40._16_4_;
      bVar33 = (bool)((byte)(uVar34 >> 5) & 1);
      auVar38._20_4_ = (uint)bVar33 * auVar73._20_4_ | (uint)!bVar33 * auVar40._20_4_;
      bVar33 = (bool)((byte)(uVar34 >> 6) & 1);
      auVar38._24_4_ = (uint)bVar33 * auVar73._24_4_ | (uint)!bVar33 * auVar40._24_4_;
      bVar33 = (bool)((byte)(uVar34 >> 7) & 1);
      auVar38._28_4_ = (uint)bVar33 * auVar73._28_4_ | (uint)!bVar33 * auVar40._28_4_;
      bVar33 = (bool)(bVar9 & 1);
      auVar38._32_4_ = (uint)bVar33 * auVar73._32_4_ | (uint)!bVar33 * auVar40._32_4_;
      bVar33 = (bool)((byte)(uVar34 >> 9) & 1);
      auVar38._36_4_ = (uint)bVar33 * auVar73._36_4_ | (uint)!bVar33 * auVar40._36_4_;
      bVar33 = (bool)((byte)(uVar34 >> 10) & 1);
      auVar38._40_4_ = (uint)bVar33 * auVar73._40_4_ | (uint)!bVar33 * auVar40._40_4_;
      bVar33 = (bool)((byte)(uVar34 >> 0xb) & 1);
      auVar38._44_4_ = (uint)bVar33 * auVar73._44_4_ | (uint)!bVar33 * auVar40._44_4_;
      bVar33 = (bool)((byte)(uVar34 >> 0xc) & 1);
      auVar38._48_4_ = (uint)bVar33 * auVar73._48_4_ | (uint)!bVar33 * auVar40._48_4_;
      bVar33 = (bool)((byte)(uVar34 >> 0xd) & 1);
      auVar38._52_4_ = (uint)bVar33 * auVar73._52_4_ | (uint)!bVar33 * auVar40._52_4_;
      bVar33 = (bool)((byte)(uVar34 >> 0xe) & 1);
      auVar38._56_4_ = (uint)bVar33 * auVar73._56_4_ | (uint)!bVar33 * auVar40._56_4_;
      bVar33 = SUB81(uVar34 >> 0xf,0);
      auVar38._60_4_ = (uint)bVar33 * auVar73._60_4_ | (uint)!bVar33 * auVar40._60_4_;
      auVar37 = vfmadd132ps_avx512f(auVar39,auVar37,auVar37);
      auVar73 = vfmadd132ps_avx512f(auVar43,auVar42,auVar42);
      puVar30 = local_4448 + 1;
      local_4450 = 0xfffffffffffffff8;
      pauVar31 = (undefined1 (*) [64])local_3c40;
      local_3c80 = auVar46;
      auVar39 = vmulps_avx512f(auVar37,auVar47);
      auVar40 = vmulps_avx512f(auVar49,auVar48);
      auVar43 = vmulps_avx512f(auVar73,auVar45);
      local_3cc0 = auVar44;
      do {
        pauVar31 = pauVar31 + -1;
        uVar29 = puVar30[-1];
        puVar30 = puVar30 + -1;
        bVar33 = true;
        if (uVar29 != 0xfffffffffffffff8) {
          uVar18 = vcmpps_avx512f(*pauVar31,auVar38,1);
          auVar41 = *pauVar31;
          auVar42 = auVar38;
          if ((short)uVar18 != 0) {
LAB_00956652:
            uVar26 = (uint)uVar29;
            if ((uVar29 & 8) == 0) goto code_r0x0095665c;
            if (uVar29 == 0xfffffffffffffff8) goto LAB_009567d6;
            uVar18 = vcmpps_avx512f(auVar38,auVar41,6);
            if ((short)uVar18 != 0) {
              uVar23 = (ulong)(uVar26 & 0xf);
              uVar26 = uVar27;
              if (uVar23 != 8) {
                uVar26 = ~uVar27;
                uVar28 = 1;
                local_46c0 = auVar43;
                local_4680 = auVar40;
                local_4640 = auVar39;
                local_4600 = auVar38;
                local_45c0 = auVar46;
                local_4580 = auVar73;
                local_4540 = auVar49;
                local_4500 = auVar37;
                do {
                  local_4708.geomID = *(uint *)(((uVar29 & 0xfffffffffffffff0) - 8) + uVar28 * 8);
                  local_46d8 = (context->scene->geometries).items[local_4708.geomID].ptr;
                  auVar41 = vpbroadcastd_avx512f(ZEXT416(local_46d8->mask));
                  uVar18 = vptestmd_avx512f(auVar41,*(undefined1 (*) [64])(ray + 0x240));
                  uVar25 = (ushort)uVar18 & (ushort)uVar26;
                  if (uVar25 == 0) {
                    uVar25 = 0xffff;
                  }
                  else {
                    local_4708.primID = *(uint *)(((uVar29 & 0xfffffffffffffff0) - 4) + uVar28 * 8);
                    auVar37 = vpmovm2d_avx512dq((ulong)uVar25);
                    local_44c0 = vmovdqa64_avx512f(auVar37);
                    local_4708.valid = (int *)local_44c0;
                    local_4708.geometryUserPtr = local_46d8->userPtr;
                    local_4708.context = context->user;
                    local_4708.N = 0x10;
                    local_46d0 = 0;
                    local_46c8 = context->args;
                    p_Var24 = local_46c8->intersect;
                    if (p_Var24 == (RTCIntersectFunctionN)0x0) {
                      p_Var24 = (RTCIntersectFunctionN)
                                local_46d8[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i;
                    }
                    local_4708.rayhit = (RTCRayHitN *)ray;
                    (*p_Var24)(&local_4708);
                    uVar18 = vcmpps_avx512f(ZEXT1664((undefined1  [16])0x0),
                                            *(undefined1 (*) [64])(ray + 0x200),10);
                    uVar25 = (ushort)uVar18;
                    auVar44 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                    auVar37 = local_4500;
                    auVar49 = local_4540;
                    auVar73 = local_4580;
                    auVar46 = local_45c0;
                    auVar38 = local_4600;
                    auVar39 = local_4640;
                    auVar40 = local_4680;
                    auVar43 = local_46c0;
                  }
                  uVar25 = (ushort)uVar26 & uVar25;
                  uVar26 = (uint)uVar25;
                } while ((uVar25 != 0) &&
                        (bVar33 = uVar28 < uVar23 - 8, uVar28 = uVar28 + 1, bVar33));
                uVar26 = ~(uint)uVar25;
              }
              bVar33 = true;
              uVar27 = uVar27 | uVar26;
              if ((short)uVar27 != -1) {
                auVar41 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                bVar33 = (bool)((byte)uVar27 & 1);
                auVar42._0_4_ = (uint)bVar33 * auVar41._0_4_ | (uint)!bVar33 * auVar38._0_4_;
                bVar33 = (bool)((byte)(uVar27 >> 1) & 1);
                auVar42._4_4_ = (uint)bVar33 * auVar41._4_4_ | (uint)!bVar33 * auVar38._4_4_;
                bVar33 = (bool)((byte)(uVar27 >> 2) & 1);
                auVar42._8_4_ = (uint)bVar33 * auVar41._8_4_ | (uint)!bVar33 * auVar38._8_4_;
                bVar33 = (bool)((byte)(uVar27 >> 3) & 1);
                auVar42._12_4_ = (uint)bVar33 * auVar41._12_4_ | (uint)!bVar33 * auVar38._12_4_;
                bVar33 = (bool)((byte)(uVar27 >> 4) & 1);
                auVar42._16_4_ = (uint)bVar33 * auVar41._16_4_ | (uint)!bVar33 * auVar38._16_4_;
                bVar33 = (bool)((byte)(uVar27 >> 5) & 1);
                auVar42._20_4_ = (uint)bVar33 * auVar41._20_4_ | (uint)!bVar33 * auVar38._20_4_;
                bVar33 = (bool)((byte)(uVar27 >> 6) & 1);
                auVar42._24_4_ = (uint)bVar33 * auVar41._24_4_ | (uint)!bVar33 * auVar38._24_4_;
                bVar33 = (bool)((byte)(uVar27 >> 7) & 1);
                auVar42._28_4_ = (uint)bVar33 * auVar41._28_4_ | (uint)!bVar33 * auVar38._28_4_;
                bVar33 = (bool)((byte)(uVar27 >> 8) & 1);
                auVar42._32_4_ = (uint)bVar33 * auVar41._32_4_ | (uint)!bVar33 * auVar38._32_4_;
                bVar33 = (bool)((byte)(uVar27 >> 9) & 1);
                auVar42._36_4_ = (uint)bVar33 * auVar41._36_4_ | (uint)!bVar33 * auVar38._36_4_;
                bVar33 = (bool)((byte)(uVar27 >> 10) & 1);
                auVar42._40_4_ = (uint)bVar33 * auVar41._40_4_ | (uint)!bVar33 * auVar38._40_4_;
                bVar33 = (bool)((byte)(uVar27 >> 0xb) & 1);
                auVar42._44_4_ = (uint)bVar33 * auVar41._44_4_ | (uint)!bVar33 * auVar38._44_4_;
                bVar33 = (bool)((byte)(uVar27 >> 0xc) & 1);
                auVar42._48_4_ = (uint)bVar33 * auVar41._48_4_ | (uint)!bVar33 * auVar38._48_4_;
                bVar33 = (bool)((byte)(uVar27 >> 0xd) & 1);
                auVar42._52_4_ = (uint)bVar33 * auVar41._52_4_ | (uint)!bVar33 * auVar38._52_4_;
                bVar33 = (bool)((byte)(uVar27 >> 0xe) & 1);
                auVar42._56_4_ = (uint)bVar33 * auVar41._56_4_ | (uint)!bVar33 * auVar38._56_4_;
                bVar33 = (bool)((byte)(uVar27 >> 0xf) & 1);
                auVar42._60_4_ = (uint)bVar33 * auVar41._60_4_ | (uint)!bVar33 * auVar38._60_4_;
                goto LAB_009567d3;
              }
              goto LAB_009567d6;
            }
          }
LAB_009567d3:
          bVar33 = false;
          auVar38 = auVar42;
        }
LAB_009567d6:
      } while (!bVar33);
      uVar27 = uVar27 & (uint)uVar34;
      auVar37 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      bVar33 = (bool)((byte)uVar27 & 1);
      bVar32 = (bool)((byte)(uVar27 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar27 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar27 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar27 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar27 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar27 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar27 >> 7) & 1);
      bVar10 = (bool)((byte)(uVar27 >> 8) & 1);
      bVar11 = (bool)((byte)(uVar27 >> 9) & 1);
      bVar12 = (bool)((byte)(uVar27 >> 10) & 1);
      bVar13 = (bool)((byte)(uVar27 >> 0xb) & 1);
      bVar14 = (bool)((byte)(uVar27 >> 0xc) & 1);
      bVar15 = (bool)((byte)(uVar27 >> 0xd) & 1);
      bVar16 = (bool)((byte)(uVar27 >> 0xe) & 1);
      bVar17 = (bool)((byte)(uVar27 >> 0xf) & 1);
      *(uint *)(ray + 0x200) = (uint)bVar33 * auVar37._0_4_ | (uint)!bVar33 * *(int *)(ray + 0x200);
      *(uint *)(ray + 0x204) = (uint)bVar32 * auVar37._4_4_ | (uint)!bVar32 * *(int *)(ray + 0x204);
      *(uint *)(ray + 0x208) = (uint)bVar3 * auVar37._8_4_ | (uint)!bVar3 * *(int *)(ray + 0x208);
      *(uint *)(ray + 0x20c) = (uint)bVar4 * auVar37._12_4_ | (uint)!bVar4 * *(int *)(ray + 0x20c);
      *(uint *)(ray + 0x210) = (uint)bVar5 * auVar37._16_4_ | (uint)!bVar5 * *(int *)(ray + 0x210);
      *(uint *)(ray + 0x214) = (uint)bVar6 * auVar37._20_4_ | (uint)!bVar6 * *(int *)(ray + 0x214);
      *(uint *)(ray + 0x218) = (uint)bVar7 * auVar37._24_4_ | (uint)!bVar7 * *(int *)(ray + 0x218);
      *(uint *)(ray + 0x21c) = (uint)bVar8 * auVar37._28_4_ | (uint)!bVar8 * *(int *)(ray + 0x21c);
      *(uint *)(ray + 0x220) = (uint)bVar10 * auVar37._32_4_ | (uint)!bVar10 * *(int *)(ray + 0x220)
      ;
      *(uint *)(ray + 0x224) = (uint)bVar11 * auVar37._36_4_ | (uint)!bVar11 * *(int *)(ray + 0x224)
      ;
      *(uint *)(ray + 0x228) = (uint)bVar12 * auVar37._40_4_ | (uint)!bVar12 * *(int *)(ray + 0x228)
      ;
      *(uint *)(ray + 0x22c) = (uint)bVar13 * auVar37._44_4_ | (uint)!bVar13 * *(int *)(ray + 0x22c)
      ;
      *(uint *)(ray + 0x230) = (uint)bVar14 * auVar37._48_4_ | (uint)!bVar14 * *(int *)(ray + 0x230)
      ;
      *(uint *)(ray + 0x234) = (uint)bVar15 * auVar37._52_4_ | (uint)!bVar15 * *(int *)(ray + 0x234)
      ;
      *(uint *)(ray + 0x238) = (uint)bVar16 * auVar37._56_4_ | (uint)!bVar16 * *(int *)(ray + 0x238)
      ;
      *(uint *)(ray + 0x23c) = (uint)bVar17 * auVar37._60_4_ | (uint)!bVar17 * *(int *)(ray + 0x23c)
      ;
    }
  }
  return;
code_r0x0095665c:
  uVar22 = uVar29 & 0xfffffffffffffff0;
  uVar23 = 0;
  uVar28 = 8;
  auVar45 = auVar44;
  do {
    uVar2 = *(ulong *)(uVar22 + uVar23 * 8);
    uVar29 = uVar28;
    auVar47 = auVar45;
    if (uVar2 != 8) {
      auVar50 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar22 + 0x80 + uVar23 * 4)));
      auVar48 = *(undefined1 (*) [64])(ray + 0x1c0);
      uVar1 = *(undefined4 *)(uVar22 + 0x20 + uVar23 * 4);
      auVar51._4_4_ = uVar1;
      auVar51._0_4_ = uVar1;
      auVar51._8_4_ = uVar1;
      auVar51._12_4_ = uVar1;
      auVar51._16_4_ = uVar1;
      auVar51._20_4_ = uVar1;
      auVar51._24_4_ = uVar1;
      auVar51._28_4_ = uVar1;
      auVar51._32_4_ = uVar1;
      auVar51._36_4_ = uVar1;
      auVar51._40_4_ = uVar1;
      auVar51._44_4_ = uVar1;
      auVar51._48_4_ = uVar1;
      auVar51._52_4_ = uVar1;
      auVar51._56_4_ = uVar1;
      auVar51._60_4_ = uVar1;
      auVar51 = vfmadd213ps_avx512f(auVar50,auVar48,auVar51);
      auVar52 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar22 + 0xa0 + uVar23 * 4)));
      uVar1 = *(undefined4 *)(uVar22 + 0x40 + uVar23 * 4);
      auVar50._4_4_ = uVar1;
      auVar50._0_4_ = uVar1;
      auVar50._8_4_ = uVar1;
      auVar50._12_4_ = uVar1;
      auVar50._16_4_ = uVar1;
      auVar50._20_4_ = uVar1;
      auVar50._24_4_ = uVar1;
      auVar50._28_4_ = uVar1;
      auVar50._32_4_ = uVar1;
      auVar50._36_4_ = uVar1;
      auVar50._40_4_ = uVar1;
      auVar50._44_4_ = uVar1;
      auVar50._48_4_ = uVar1;
      auVar50._52_4_ = uVar1;
      auVar50._56_4_ = uVar1;
      auVar50._60_4_ = uVar1;
      auVar50 = vfmadd213ps_avx512f(auVar52,auVar48,auVar50);
      auVar53 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar22 + 0xc0 + uVar23 * 4)));
      uVar1 = *(undefined4 *)(uVar22 + 0x60 + uVar23 * 4);
      auVar52._4_4_ = uVar1;
      auVar52._0_4_ = uVar1;
      auVar52._8_4_ = uVar1;
      auVar52._12_4_ = uVar1;
      auVar52._16_4_ = uVar1;
      auVar52._20_4_ = uVar1;
      auVar52._24_4_ = uVar1;
      auVar52._28_4_ = uVar1;
      auVar52._32_4_ = uVar1;
      auVar52._36_4_ = uVar1;
      auVar52._40_4_ = uVar1;
      auVar52._44_4_ = uVar1;
      auVar52._48_4_ = uVar1;
      auVar52._52_4_ = uVar1;
      auVar52._56_4_ = uVar1;
      auVar52._60_4_ = uVar1;
      auVar52 = vfmadd213ps_avx512f(auVar53,auVar48,auVar52);
      auVar54 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar22 + 0x90 + uVar23 * 4)));
      uVar1 = *(undefined4 *)(uVar22 + 0x30 + uVar23 * 4);
      auVar53._4_4_ = uVar1;
      auVar53._0_4_ = uVar1;
      auVar53._8_4_ = uVar1;
      auVar53._12_4_ = uVar1;
      auVar53._16_4_ = uVar1;
      auVar53._20_4_ = uVar1;
      auVar53._24_4_ = uVar1;
      auVar53._28_4_ = uVar1;
      auVar53._32_4_ = uVar1;
      auVar53._36_4_ = uVar1;
      auVar53._40_4_ = uVar1;
      auVar53._44_4_ = uVar1;
      auVar53._48_4_ = uVar1;
      auVar53._52_4_ = uVar1;
      auVar53._56_4_ = uVar1;
      auVar53._60_4_ = uVar1;
      auVar53 = vfmadd213ps_avx512f(auVar54,auVar48,auVar53);
      auVar55 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar22 + 0xb0 + uVar23 * 4)));
      uVar1 = *(undefined4 *)(uVar22 + 0x50 + uVar23 * 4);
      auVar54._4_4_ = uVar1;
      auVar54._0_4_ = uVar1;
      auVar54._8_4_ = uVar1;
      auVar54._12_4_ = uVar1;
      auVar54._16_4_ = uVar1;
      auVar54._20_4_ = uVar1;
      auVar54._24_4_ = uVar1;
      auVar54._28_4_ = uVar1;
      auVar54._32_4_ = uVar1;
      auVar54._36_4_ = uVar1;
      auVar54._40_4_ = uVar1;
      auVar54._44_4_ = uVar1;
      auVar54._48_4_ = uVar1;
      auVar54._52_4_ = uVar1;
      auVar54._56_4_ = uVar1;
      auVar54._60_4_ = uVar1;
      auVar54 = vfmadd213ps_avx512f(auVar55,auVar48,auVar54);
      auVar56 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar22 + 0xd0 + uVar23 * 4)));
      uVar1 = *(undefined4 *)(uVar22 + 0x70 + uVar23 * 4);
      auVar55._4_4_ = uVar1;
      auVar55._0_4_ = uVar1;
      auVar55._8_4_ = uVar1;
      auVar55._12_4_ = uVar1;
      auVar55._16_4_ = uVar1;
      auVar55._20_4_ = uVar1;
      auVar55._24_4_ = uVar1;
      auVar55._28_4_ = uVar1;
      auVar55._32_4_ = uVar1;
      auVar55._36_4_ = uVar1;
      auVar55._40_4_ = uVar1;
      auVar55._44_4_ = uVar1;
      auVar55._48_4_ = uVar1;
      auVar55._52_4_ = uVar1;
      auVar55._56_4_ = uVar1;
      auVar55._60_4_ = uVar1;
      auVar55 = vfmadd213ps_avx512f(auVar56,auVar48,auVar55);
      auVar51 = vfmadd213ps_avx512f(auVar51,auVar37,auVar39);
      auVar50 = vfmadd213ps_avx512f(auVar50,auVar49,auVar40);
      auVar52 = vfmadd213ps_avx512f(auVar52,auVar73,auVar43);
      auVar53 = vfmadd213ps_avx512f(auVar53,auVar37,auVar39);
      auVar54 = vfmadd213ps_avx512f(auVar54,auVar49,auVar40);
      auVar55 = vfmadd213ps_avx512f(auVar55,auVar73,auVar43);
      auVar56 = vpminsd_avx512f(auVar51,auVar53);
      auVar57 = vpminsd_avx512f(auVar50,auVar54);
      auVar56 = vpmaxsd_avx512f(auVar56,auVar57);
      auVar57 = vpminsd_avx512f(auVar52,auVar55);
      auVar56 = vpmaxsd_avx512f(auVar56,auVar57);
      auVar51 = vpmaxsd_avx512f(auVar51,auVar53);
      auVar50 = vpmaxsd_avx512f(auVar50,auVar54);
      auVar51 = vpminsd_avx512f(auVar51,auVar50);
      auVar50 = vpmaxsd_avx512f(auVar52,auVar55);
      auVar52 = vpmaxsd_avx512f(auVar56,auVar46);
      auVar50 = vpminsd_avx512f(auVar50,auVar38);
      auVar51 = vpminsd_avx512f(auVar51,auVar50);
      uVar35 = vcmpps_avx512f(auVar52,auVar51,2);
      if ((uVar26 & 7) == 6) {
        uVar1 = *(undefined4 *)(uVar22 + 0xe0 + uVar23 * 4);
        auVar57._4_4_ = uVar1;
        auVar57._0_4_ = uVar1;
        auVar57._8_4_ = uVar1;
        auVar57._12_4_ = uVar1;
        auVar57._16_4_ = uVar1;
        auVar57._20_4_ = uVar1;
        auVar57._24_4_ = uVar1;
        auVar57._28_4_ = uVar1;
        auVar57._32_4_ = uVar1;
        auVar57._36_4_ = uVar1;
        auVar57._40_4_ = uVar1;
        auVar57._44_4_ = uVar1;
        auVar57._48_4_ = uVar1;
        auVar57._52_4_ = uVar1;
        auVar57._56_4_ = uVar1;
        auVar57._60_4_ = uVar1;
        uVar19 = vcmpps_avx512f(auVar48,auVar57,0xd);
        uVar1 = *(undefined4 *)(uVar22 + 0xf0 + uVar23 * 4);
        auVar21._4_4_ = uVar1;
        auVar21._0_4_ = uVar1;
        auVar21._8_4_ = uVar1;
        auVar21._12_4_ = uVar1;
        auVar21._16_4_ = uVar1;
        auVar21._20_4_ = uVar1;
        auVar21._24_4_ = uVar1;
        auVar21._28_4_ = uVar1;
        auVar21._32_4_ = uVar1;
        auVar21._36_4_ = uVar1;
        auVar21._40_4_ = uVar1;
        auVar21._44_4_ = uVar1;
        auVar21._48_4_ = uVar1;
        auVar21._52_4_ = uVar1;
        auVar21._56_4_ = uVar1;
        auVar21._60_4_ = uVar1;
        uVar20 = vcmpps_avx512f(auVar48,auVar21,1);
        uVar35 = uVar35 & uVar19 & uVar20;
      }
      uVar19 = vcmpps_avx512f(auVar38,auVar41,6);
      uVar35 = uVar35 & uVar19;
      if ((short)uVar35 != 0) {
        auVar51 = vblendmps_avx512f(auVar44,auVar56);
        bVar32 = (bool)((byte)uVar35 & 1);
        auVar47._0_4_ = (uint)bVar32 * auVar51._0_4_ | (uint)!bVar32 * auVar48._0_4_;
        bVar32 = (bool)((byte)(uVar35 >> 1) & 1);
        auVar47._4_4_ = (uint)bVar32 * auVar51._4_4_ | (uint)!bVar32 * auVar48._4_4_;
        bVar32 = (bool)((byte)(uVar35 >> 2) & 1);
        auVar47._8_4_ = (uint)bVar32 * auVar51._8_4_ | (uint)!bVar32 * auVar48._8_4_;
        bVar32 = (bool)((byte)(uVar35 >> 3) & 1);
        auVar47._12_4_ = (uint)bVar32 * auVar51._12_4_ | (uint)!bVar32 * auVar48._12_4_;
        bVar32 = (bool)((byte)(uVar35 >> 4) & 1);
        auVar47._16_4_ = (uint)bVar32 * auVar51._16_4_ | (uint)!bVar32 * auVar48._16_4_;
        bVar32 = (bool)((byte)(uVar35 >> 5) & 1);
        auVar47._20_4_ = (uint)bVar32 * auVar51._20_4_ | (uint)!bVar32 * auVar48._20_4_;
        bVar32 = (bool)((byte)(uVar35 >> 6) & 1);
        auVar47._24_4_ = (uint)bVar32 * auVar51._24_4_ | (uint)!bVar32 * auVar48._24_4_;
        bVar32 = (bool)((byte)(uVar35 >> 7) & 1);
        auVar47._28_4_ = (uint)bVar32 * auVar51._28_4_ | (uint)!bVar32 * auVar48._28_4_;
        bVar32 = (bool)((byte)(uVar35 >> 8) & 1);
        auVar47._32_4_ = (uint)bVar32 * auVar51._32_4_ | (uint)!bVar32 * auVar48._32_4_;
        bVar32 = (bool)((byte)(uVar35 >> 9) & 1);
        auVar47._36_4_ = (uint)bVar32 * auVar51._36_4_ | (uint)!bVar32 * auVar48._36_4_;
        bVar32 = (bool)((byte)(uVar35 >> 10) & 1);
        auVar47._40_4_ = (uint)bVar32 * auVar51._40_4_ | (uint)!bVar32 * auVar48._40_4_;
        bVar32 = (bool)((byte)(uVar35 >> 0xb) & 1);
        auVar47._44_4_ = (uint)bVar32 * auVar51._44_4_ | (uint)!bVar32 * auVar48._44_4_;
        bVar32 = (bool)((byte)(uVar35 >> 0xc) & 1);
        auVar47._48_4_ = (uint)bVar32 * auVar51._48_4_ | (uint)!bVar32 * auVar48._48_4_;
        bVar32 = (bool)((byte)(uVar35 >> 0xd) & 1);
        auVar47._52_4_ = (uint)bVar32 * auVar51._52_4_ | (uint)!bVar32 * auVar48._52_4_;
        bVar32 = (bool)((byte)(uVar35 >> 0xe) & 1);
        auVar47._56_4_ = (uint)bVar32 * auVar51._56_4_ | (uint)!bVar32 * auVar48._56_4_;
        bVar32 = SUB81(uVar35 >> 0xf,0);
        auVar47._60_4_ = (uint)bVar32 * auVar51._60_4_ | (uint)!bVar32 * auVar48._60_4_;
        uVar29 = uVar2;
        if (uVar28 != 8) {
          *puVar30 = uVar28;
          puVar30 = puVar30 + 1;
          *pauVar31 = auVar45;
          pauVar31 = pauVar31 + 1;
        }
      }
    }
  } while ((uVar2 != 8) &&
          (bVar32 = uVar23 < 3, uVar23 = uVar23 + 1, uVar28 = uVar29, auVar45 = auVar47, bVar32));
  auVar41 = auVar47;
  if (uVar29 == 8) goto LAB_009567d3;
  goto LAB_00956652;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }